

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Descriptor * __thiscall google::protobuf::MethodDescriptor::input_type(MethodDescriptor *this)

{
  Descriptor *pDVar1;
  
  pDVar1 = internal::LazyDescriptor::Get((LazyDescriptor *)this);
  return pDVar1;
}

Assistant:

const Descriptor* MethodDescriptor::input_type() const {
  return input_type_.Get();
}